

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O0

qsizetype QtPrivate::lengthHelperPointer<char>(char *data)

{
  qsizetype i;
  char *data_local;
  qsizetype local_8;
  
  i = 0;
  if (data == (char *)0x0) {
    local_8 = 0;
  }
  else {
    for (; data[i] != '\0'; i = i + 1) {
    }
    local_8 = i;
  }
  return local_8;
}

Assistant:

static constexpr qsizetype lengthHelperPointer(const Char *data) noexcept
{
    // std::char_traits can only be used with one of the regular char types
    // (char, char16_t, wchar_t, but not uchar or QChar), so we roll the loop
    // out by ourselves.
    qsizetype i = 0;
    if (!data)
        return i;
    while (data[i] != Char(0))
        ++i;
    return i;
}